

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall TextReaderTest_InvalidFormat_Test::TestBody(TextReaderTest_InvalidFormat_Test *this)

{
  bool bVar1;
  char *message;
  StringRef line;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  NLHeader local_128;
  
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"(input):1:1: expected format specifier",
               (allocator<char> *)&local_128);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      line.size_ = 1;
      line.data_ = "x";
      ReadHeader(&local_128,0,line);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [97])
               "Expected: ReadHeader(0, \"x\") throws an exception of type ReadError.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&local_128);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_expected_message,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0xdf,message);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&gtest_expected_message,(Message *)&local_128);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_128);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(TextReaderTest, InvalidFormat) {
  EXPECT_THROW_MSG(ReadHeader(0, "x"),
      ReadError, "(input):1:1: expected format specifier");
}